

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::DescriptorProto::ByteSizeLong(DescriptorProto *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  SymbolVisibility value;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar4;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  reference value_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  reference value_01;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_02;
  reference value_02;
  reference pFVar5;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *this_03;
  reference value_03;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *this_04;
  reference value_04;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  size_t sVar7;
  const_reference value_05;
  uint32_t *puVar8;
  string *value_06;
  int local_144;
  int n;
  int i;
  DescriptorProto_ReservedRange *msg_6;
  const_iterator __end3_6;
  const_iterator __begin3_6;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *__range3_6;
  OneofDescriptorProto *msg_5;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *__range3_5;
  FieldDescriptorProto *msg_4;
  const_iterator __end3_4;
  const_iterator __begin3_4;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range3_4;
  DescriptorProto_ExtensionRange *msg_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *__range3_3;
  EnumDescriptorProto *msg_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *__range3_2;
  DescriptorProto *msg_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  RepeatedPtrField<google::protobuf::DescriptorProto> *__range3_1;
  FieldDescriptorProto *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  DescriptorProto *this_;
  DescriptorProto *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_field_size(this);
  sStack_58 = (size_t)iVar3;
  pRVar4 = _internal_field(this);
  __end3 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(pRVar4);
  msg = (FieldDescriptorProto *)
        RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(pRVar4);
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    pFVar5 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator*
                       (&__end3);
    sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>(pFVar5);
    sStack_58 = sVar7 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++(&__end3)
    ;
  }
  iVar3 = _internal_nested_type_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  this_00 = _internal_nested_type(this);
  __end3_1 = RepeatedPtrField<google::protobuf::DescriptorProto>::begin(this_00);
  msg_1 = (DescriptorProto *)RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00);
  while (bVar2 = internal::operator!=(&__end3_1,(iterator *)&msg_1), bVar2) {
    value_00 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator*
                         (&__end3_1);
    sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto>(value_00);
    sStack_58 = sVar7 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator++(&__end3_1);
  }
  iVar3 = _internal_enum_type_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  this_01 = _internal_enum_type(this);
  __end3_2 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::begin(this_01);
  msg_2 = (EnumDescriptorProto *)
          RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end(this_01);
  while (bVar2 = internal::operator!=(&__end3_2,(iterator *)&msg_2), bVar2) {
    value_01 = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator*
                         (&__end3_2);
    sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::EnumDescriptorProto>(value_01);
    sStack_58 = sVar7 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator++
              (&__end3_2);
  }
  iVar3 = _internal_extension_range_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  this_02 = _internal_extension_range(this);
  __end3_3 = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::begin(this_02);
  msg_3 = (DescriptorProto_ExtensionRange *)
          RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::end(this_02);
  while (bVar2 = internal::operator!=(&__end3_3,(iterator *)&msg_3), bVar2) {
    value_02 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ExtensionRange>
               ::operator*(&__end3_3);
    sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto_ExtensionRange>
                      (value_02);
    sStack_58 = sVar7 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ExtensionRange>::
    operator++(&__end3_3);
  }
  iVar3 = _internal_extension_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  pRVar4 = _internal_extension(this);
  __end3_4 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(pRVar4);
  msg_4 = (FieldDescriptorProto *)
          RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(pRVar4);
  while (bVar2 = internal::operator!=(&__end3_4,(iterator *)&msg_4), bVar2) {
    pFVar5 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator*
                       (&__end3_4);
    sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>(pFVar5);
    sStack_58 = sVar7 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++
              (&__end3_4);
  }
  iVar3 = _internal_oneof_decl_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  this_03 = _internal_oneof_decl(this);
  __end3_5 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::begin(this_03);
  msg_5 = (OneofDescriptorProto *)
          RepeatedPtrField<google::protobuf::OneofDescriptorProto>::end(this_03);
  while (bVar2 = internal::operator!=(&__end3_5,(iterator *)&msg_5), bVar2) {
    value_03 = internal::RepeatedPtrIterator<const_google::protobuf::OneofDescriptorProto>::
               operator*(&__end3_5);
    sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::OneofDescriptorProto>(value_03);
    sStack_58 = sVar7 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::OneofDescriptorProto>::operator++
              (&__end3_5);
  }
  iVar3 = _internal_reserved_range_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  this_04 = _internal_reserved_range(this);
  __end3_6 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::begin(this_04);
  msg_6 = (DescriptorProto_ReservedRange *)
          RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::end(this_04);
  while (bVar2 = internal::operator!=(&__end3_6,(iterator *)&msg_6), bVar2) {
    value_04 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ReservedRange>
               ::operator*(&__end3_6);
    sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto_ReservedRange>
                      (value_04);
    sStack_58 = sVar7 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto_ReservedRange>::operator++
              (&__end3_6);
  }
  pRVar6 = _internal_reserved_name_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  sVar7 = internal::FromIntSize(iVar3);
  sStack_58 = sVar7 + sStack_58;
  local_144 = 0;
  pRVar6 = _internal_reserved_name_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  for (; local_144 < iVar3; local_144 = local_144 + 1) {
    pRVar6 = _internal_reserved_name_abi_cxx11_(this);
    value_05 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Get(pRVar6,local_144);
    sVar7 = internal::WireFormatLite::StringSize(value_05);
    sStack_58 = sVar7 + sStack_58;
  }
  puVar8 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar8;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      value_06 = _internal_name_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(value_06);
      sStack_58 = sVar7 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::MessageOptions>
                        ((this->field_0)._impl_.options_);
      sStack_58 = sVar7 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      value = _internal_visibility(this);
      sVar7 = internal::WireFormatLite::EnumSize(value);
      sStack_58 = sVar7 + 1 + sStack_58;
    }
  }
  sVar7 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t DescriptorProto::ByteSizeLong() const {
  const DescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FieldDescriptorProto field = 2;
    {
      total_size += 1UL * this_._internal_field_size();
      for (const auto& msg : this_._internal_field()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.DescriptorProto nested_type = 3;
    {
      total_size += 1UL * this_._internal_nested_type_size();
      for (const auto& msg : this_._internal_nested_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
    {
      total_size += 1UL * this_._internal_enum_type_size();
      for (const auto& msg : this_._internal_enum_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
    {
      total_size += 1UL * this_._internal_extension_range_size();
      for (const auto& msg : this_._internal_extension_range()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.FieldDescriptorProto extension = 6;
    {
      total_size += 1UL * this_._internal_extension_size();
      for (const auto& msg : this_._internal_extension()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
    {
      total_size += 1UL * this_._internal_oneof_decl_size();
      for (const auto& msg : this_._internal_oneof_decl()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
    {
      total_size += 1UL * this_._internal_reserved_range_size();
      for (const auto& msg : this_._internal_reserved_range()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated string reserved_name = 10;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_reserved_name().size());
      for (int i = 0, n = this_._internal_reserved_name().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_reserved_name().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.MessageOptions options = 7;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional .google.protobuf.SymbolVisibility visibility = 11;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_visibility());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}